

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatQueue.c
# Opt level: O3

Msat_Queue_t * Msat_QueueAlloc(int nVars)

{
  Msat_Queue_t *pMVar1;
  int *piVar2;
  
  pMVar1 = (Msat_Queue_t *)calloc(1,0x18);
  pMVar1->nVars = nVars;
  piVar2 = (int *)malloc((long)nVars << 2);
  pMVar1->pVars = piVar2;
  return pMVar1;
}

Assistant:

Msat_Queue_t * Msat_QueueAlloc( int nVars )
{
    Msat_Queue_t * p;
    p = ABC_ALLOC( Msat_Queue_t, 1 );
    memset( p, 0, sizeof(Msat_Queue_t) );
    p->nVars  = nVars;
    p->pVars  = ABC_ALLOC( int, nVars );
    return p;
}